

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fixDistinctOpenEph(Parse *pParse,int eTnctType,int iVal,int iOpenEphAddr)

{
  Vdbe *p;
  VdbeOp *pVVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  VdbeOp *pOp;
  Vdbe *v;
  int addr;
  undefined4 in_stack_ffffffffffffffe8;
  
  if ((*(int *)(in_RDI + 0x34) == 0) && ((in_ESI == 1 || (in_ESI == 2)))) {
    p = *(Vdbe **)(in_RDI + 0x10);
    addr = (int)((ulong)p >> 0x20);
    sqlite3VdbeChangeToNoop((Vdbe *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),addr);
    pVVar1 = sqlite3VdbeGetOp(p,in_ECX + 1);
    if (pVVar1->opcode == 0xbc) {
      sqlite3VdbeChangeToNoop((Vdbe *)CONCAT44(in_ECX,in_stack_ffffffffffffffe8),addr);
    }
    if (in_ESI == 2) {
      pVVar1 = sqlite3VdbeGetOp(p,in_ECX);
      pVVar1->opcode = 'K';
      pVVar1->p1 = 1;
      pVVar1->p2 = in_EDX;
    }
  }
  return;
}

Assistant:

static void fixDistinctOpenEph(
  Parse *pParse,     /* Parsing and code generating context */
  int eTnctType,     /* WHERE_DISTINCT_* value */
  int iVal,          /* Value returned by codeDistinct() */
  int iOpenEphAddr   /* Address of OP_OpenEphemeral instruction for iTab */
){
  if( pParse->nErr==0
   && (eTnctType==WHERE_DISTINCT_UNIQUE || eTnctType==WHERE_DISTINCT_ORDERED)
  ){
    Vdbe *v = pParse->pVdbe;
    sqlite3VdbeChangeToNoop(v, iOpenEphAddr);
    if( sqlite3VdbeGetOp(v, iOpenEphAddr+1)->opcode==OP_Explain ){
      sqlite3VdbeChangeToNoop(v, iOpenEphAddr+1);
    }
    if( eTnctType==WHERE_DISTINCT_ORDERED ){
      /* Change the OP_OpenEphemeral to an OP_Null that sets the MEM_Cleared
      ** bit on the first register of the previous value.  This will cause the
      ** OP_Ne added in codeDistinct() to always fail on the first iteration of
      ** the loop even if the first row is all NULLs.  */
      VdbeOp *pOp = sqlite3VdbeGetOp(v, iOpenEphAddr);
      pOp->opcode = OP_Null;
      pOp->p1 = 1;
      pOp->p2 = iVal;
    }
  }
}